

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lzma2Dec.c
# Opt level: O1

SRes Lzma2Dec_Allocate(CLzma2Dec *p,Byte prop,ISzAlloc *alloc)

{
  int iVar1;
  SRes SVar2;
  undefined8 in_RAX;
  Byte props [5];
  undefined8 uStack_8;
  
  SVar2 = 4;
  uStack_8 = in_RAX;
  if (prop < 0x29) {
    iVar1 = -1;
    if (prop != '(') {
      iVar1 = (prop & 1 | 2) << ((prop >> 1) + 0xb & 0x1f);
    }
    uStack_8 = CONCAT17((char)((uint)iVar1 >> 0x18),
                        CONCAT16((char)((uint)iVar1 >> 0x10),
                                 CONCAT15((char)((uint)iVar1 >> 8),
                                          CONCAT14((char)iVar1,CONCAT13(4,(int3)in_RAX)))));
    SVar2 = 0;
  }
  if (prop < 0x29) {
    SVar2 = LzmaDec_Allocate(&p->decoder,(Byte *)((long)&uStack_8 + 3),5,alloc);
  }
  return SVar2;
}

Assistant:

SRes Lzma2Dec_Allocate(CLzma2Dec *p, Byte prop, ISzAlloc *alloc)
{
  Byte props[LZMA_PROPS_SIZE];
  RINOK(Lzma2Dec_GetOldProps(prop, props));
  return LzmaDec_Allocate(&p->decoder, props, LZMA_PROPS_SIZE, alloc);
}